

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O3

void __thiscall
ExprSequence::ExprSequence
          (ExprSequence *this,Allocator *allocator,SynBase *source,TypeBase *type,
          ArrayView<ExprBase_*> arr)

{
  uint uVar1;
  ExprBase **ppEVar2;
  ExprBase *pEVar3;
  uint newSize;
  ulong uVar4;
  
  (this->super_ExprBase).typeID = 0x37;
  (this->super_ExprBase).source = source;
  (this->super_ExprBase).type = type;
  (this->super_ExprBase).next = (ExprBase *)0x0;
  (this->super_ExprBase).listed = false;
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprSequence_003e6310;
  (this->expressions).allocator = allocator;
  (this->expressions).data = (this->expressions).little;
  (this->expressions).count = 0;
  (this->expressions).max = 4;
  if (arr.count != 0) {
    newSize = 0;
    uVar4 = 0;
    do {
      if (newSize == (this->expressions).max) {
        SmallArray<ExprBase_*,_4U>::grow(&this->expressions,newSize);
      }
      ppEVar2 = (this->expressions).data;
      if (ppEVar2 == (ExprBase **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ExprBase *, 4>::push_back(const T &) [T = ExprBase *, N = 4]"
                     );
      }
      pEVar3 = arr.data[uVar4];
      uVar1 = (this->expressions).count;
      newSize = uVar1 + 1;
      (this->expressions).count = newSize;
      ppEVar2[uVar1] = pEVar3;
      uVar4 = uVar4 + 1;
    } while (arr.count != uVar4);
  }
  return;
}

Assistant:

ExprBase(unsigned typeID, SynBase *source, TypeBase *type): typeID(typeID), source(source), type(type), next(0), listed(false)
	{
	}